

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

void replay_read_newgame(unsigned_long_long *init,int *playmode,char *namebuf,int *initrole,
                        int *initrace,int *initgend,int *initalign)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  uint seed;
  int ver2;
  int n;
  uint local_148;
  int local_144;
  int local_140;
  undefined1 local_13c [4];
  char local_138 [264];
  
  pcVar2 = next_log_token();
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcmp(pcVar2,"NHGAME");
    if (iVar1 == 0) {
      next_log_token();
      next_log_token();
      next_log_token();
      pcVar2 = next_log_token();
      iVar1 = __isoc99_sscanf(pcVar2,"%d.%d.%d",&local_140,&local_144,local_13c);
      if (iVar1 != 3) {
        parse_error("No version found where it was expected");
      }
      if (local_144 != 6 && local_140 != 0) {
        raw_printf("Warning: Version mismatch; expected %d.%d, got %d.%d\n",0,6);
      }
      pcVar2 = next_log_token();
      local_138[0] = '\0';
      local_138[1] = '\0';
      local_138[2] = '\0';
      local_138[3] = '\0';
      __isoc99_sscanf(pcVar2,"%llx%n",init);
      pcVar2 = next_log_token();
      __isoc99_sscanf(pcVar2,"%x",&local_148);
      pcVar2 = next_log_token();
      iVar1 = atoi(pcVar2);
      *playmode = iVar1;
      pcVar2 = next_log_token();
      base64_decode(pcVar2,namebuf);
      pcVar2 = next_log_token();
      iVar1 = str2role(pcVar2);
      *initrole = iVar1;
      pcVar2 = next_log_token();
      iVar1 = str2race(pcVar2);
      *initrace = iVar1;
      pcVar2 = next_log_token();
      iVar1 = str2gend(pcVar2);
      *initgend = iVar1;
      pcVar2 = next_log_token();
      iVar1 = str2align(pcVar2);
      *initalign = iVar1;
      if ((((*initrole != -1) && (*initrace != -1)) && (*initgend != -1)) && (iVar1 != -1)) {
        mt_srand(local_148);
        pcVar2 = next_log_token();
        lVar3 = strtol(pcVar2,(char **)0x0,0x10);
        iVar1 = (int)lVar3;
        if (iVar1 == 0) {
          cmdcount = iVar1;
          parse_error("expected number of commands");
        }
        cmdcount = iVar1 + 1;
        commands = (char **)malloc((long)iVar1 * 8 + 8);
        *commands = (char *)0x0;
        if (0 < iVar1) {
          lVar3 = 1;
          do {
            pcVar2 = next_log_token();
            iVar1 = base64_strlen(pcVar2);
            if (0x200 < iVar1) {
              parse_error("Encoded command name is too long for the decode buffer");
            }
            base64_decode(pcVar2,local_138);
            pcVar2 = strdup(local_138);
            commands[lVar3] = pcVar2;
            lVar3 = lVar3 + 1;
          } while (lVar3 < cmdcount);
        }
        return;
      }
      terminate();
    }
  }
  parse_error("This file does not look like a valid logfile.");
}

Assistant:

void replay_read_newgame(unsigned long long *init, int *playmode, char *namebuf,
			 int *initrole, int *initrace, int *initgend, int *initalign)
{
    char *header, *verstr;
    int ver1, ver2, ver3, n;
    unsigned int seed;
    
    header = next_log_token();
    if (!header || strcmp(header, "NHGAME"))
	parse_error("This file does not look like a valid logfile.");
    /* now header is not read any more */

    next_log_token(); /* marker */
    next_log_token(); /* end pos, see replay_begin() */
    next_log_token(); /* action count, see replay_begin() */
    verstr = next_log_token();
    
    n = sscanf(verstr, "%d.%d.%d", &ver1, &ver2, &ver3);
    if (n != 3)
	parse_error("No version found where it was expected");
    /* now verstr is not read any more */

    if (ver1 != VERSION_MAJOR && ver2 != VERSION_MINOR)
	raw_printf("Warning: Version mismatch; expected %d.%d, got %d.%d\n",
		   VERSION_MAJOR, VERSION_MINOR, ver1, ver2);

    sscan_llx(next_log_token(), init);
    sscanf(next_log_token(), "%x", &seed);
    *playmode = atoi(next_log_token());
    base64_decode(next_log_token(), namebuf);
    *initrole = str2role(next_log_token());
    *initrace = str2race(next_log_token());
    *initgend = str2gend(next_log_token());
    *initalign = str2align(next_log_token());

    if (*initrole == ROLE_NONE || *initrace == ROLE_NONE ||
	*initgend == ROLE_NONE || *initalign == ROLE_NONE)
	terminate();
    
    mt_srand(seed);
    
    replay_read_commandlist();
}